

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertorsTestCase.cpp
# Opt level: O2

void __thiscall SuiteFieldConvertorsTests::TestbooleanConvertTo::RunImpl(TestbooleanConvertTo *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  bool value;
  bool value_00;
  string sStack_48;
  TestDetails local_28;
  
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::BoolConvertor::convert_abi_cxx11_(&sStack_48,(BoolConvertor *)0x1,value);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0xe3);
  UnitTest::CheckEqual<char[2],std::__cxx11::string>
            (pTVar1,(char (*) [2])0x2a1da4,&sStack_48,&local_28);
  std::__cxx11::string::~string((string *)&sStack_48);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::BoolConvertor::convert_abi_cxx11_(&sStack_48,(BoolConvertor *)0x0,value_00);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0xe4);
  UnitTest::CheckEqual<char[2],std::__cxx11::string>
            (pTVar1,(char (*) [2])0x2b12a4,&sStack_48,&local_28);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

TEST(booleanConvertTo)
{
  CHECK_EQUAL( "Y", BoolConvertor::convert( true ) );
  CHECK_EQUAL( "N", BoolConvertor::convert( false ) );
}